

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QPointF>::appendInitialize(QArrayDataPointer<QPointF> *this,qsizetype newSize)

{
  QPointF *pQVar1;
  qreal in_RSI;
  QPointF *in_RDI;
  QPointF *e;
  QPointF *b;
  
  begin((QArrayDataPointer<QPointF> *)0x671b10);
  pQVar1 = begin((QArrayDataPointer<QPointF> *)0x671b29);
  std::uninitialized_value_construct<QPointF*>(pQVar1 + (long)in_RSI,in_RDI);
  in_RDI[1].xp = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }